

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 op_addr_block_pre(DisasContext_conflict1 *s,arg_ldst_block *a,int n)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 ret;
  int arg2;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = load_reg(s,a->rn);
  if (a->b == 0) {
    if (n == 1 || a->i != 0) goto LAB_005f689a;
    arg2 = n * -4 + 4;
  }
  else {
    arg2 = 4;
    if (a->i == 0) {
      arg2 = n * -4;
    }
  }
  tcg_gen_addi_i32_aarch64(tcg_ctx,ret,ret,arg2);
LAB_005f689a:
  if (((s->v8m_stackcheck == true) && (a->rn == 0xd)) && (a->w != 0)) {
    gen_helper_v8m_stackcheck(tcg_ctx,tcg_ctx->cpu_env,ret);
  }
  return ret;
}

Assistant:

static TCGv_i32 op_addr_block_pre(DisasContext *s, arg_ldst_block *a, int n)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr = load_reg(s, a->rn);

    if (a->b) {
        if (a->i) {
            /* pre increment */
            tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
        } else {
            /* pre decrement */
            tcg_gen_addi_i32(tcg_ctx, addr, addr, -(n * 4));
        }
    } else if (!a->i && n != 1) {
        /* post decrement */
        tcg_gen_addi_i32(tcg_ctx, addr, addr, -((n - 1) * 4));
    }

    if (s->v8m_stackcheck && a->rn == 13 && a->w) {
        /*
         * If the writeback is incrementing SP rather than
         * decrementing it, and the initial SP is below the
         * stack limit but the final written-back SP would
         * be above, then then we must not perform any memory
         * accesses, but it is IMPDEF whether we generate
         * an exception. We choose to do so in this case.
         * At this point 'addr' is the lowest address, so
         * either the original SP (if incrementing) or our
         * final SP (if decrementing), so that's what we check.
         */
        gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, addr);
    }

    return addr;
}